

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O1

void __thiscall DStrifeStatusBar::ShowPop(DStrifeStatusBar *this,int popnum)

{
  APlayerPawn *pAVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  AInventory *pAVar5;
  AInventory *pAVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  
  DBaseStatusBar::ShowPop(&this->super_DBaseStatusBar,popnum);
  if (this->CurrentPop == popnum) {
    if (popnum == 2) {
      this->KeyPopPos = this->KeyPopPos + 10;
      this->KeyPopScroll = 0x118;
      pAVar1 = ((this->super_DBaseStatusBar).CPlayer)->mo;
      pAVar6 = (pAVar1->super_AActor).Inventory.field_0.p;
      if ((pAVar6 != (AInventory *)0x0) &&
         (((pAVar6->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar1->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
        pAVar6 = (AInventory *)0x0;
      }
      bVar8 = pAVar6 == (AInventory *)0x0;
      if (!bVar8) {
        iVar7 = 0;
        do {
          pPVar2 = AKey::RegistrationInfo.MyClass;
          if ((pAVar6->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
            iVar3 = (**(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar6);
            (pAVar6->super_AActor).super_DThinker.super_DObject.Class =
                 (PClass *)CONCAT44(extraout_var,iVar3);
          }
          pPVar4 = (pAVar6->super_AActor).super_DThinker.super_DObject.Class;
          bVar9 = pPVar4 != (PClass *)0x0;
          if (pPVar4 != pPVar2 && bVar9) {
            do {
              pPVar4 = pPVar4->ParentClass;
              bVar9 = pPVar4 != (PClass *)0x0;
              if (pPVar4 == pPVar2) break;
            } while (pPVar4 != (PClass *)0x0);
          }
          if (bVar9) {
            if (iVar7 == this->KeyPopPos) {
              if (!bVar8) {
                return;
              }
              break;
            }
            iVar7 = iVar7 + 1;
          }
          pAVar5 = (pAVar6->super_AActor).Inventory.field_0.p;
          if ((pAVar5 != (AInventory *)0x0) &&
             (((pAVar5->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
            (pAVar6->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
            pAVar5 = (AInventory *)0x0;
          }
          bVar8 = pAVar5 == (AInventory *)0x0;
          pAVar6 = pAVar5;
        } while (!bVar8);
      }
    }
    this->PendingPop = 0;
    this->KeyPopScroll = 0;
    this->KeyPopPos = this->KeyPopPos + -10;
  }
  else {
    this->KeyPopPos = 0;
    this->PendingPop = popnum;
  }
  return;
}

Assistant:

void ShowPop (int popnum)
	{
		DBaseStatusBar::ShowPop(popnum);
		if (popnum == CurrentPop)
		{
			if (popnum == POP_Keys)
			{
				AInventory *item;
				int i;

				KeyPopPos += 10;
				KeyPopScroll = 280;

				for (item = CPlayer->mo->Inventory, i = 0;
					item != NULL;
					item = item->Inventory)
				{
					if (item->IsKindOf (RUNTIME_CLASS(AKey)))
					{
						if (i == KeyPopPos)
						{
							return;
						}
						i++;
					}
				}
			}
			PendingPop = POP_None;
			// Do not scroll keys horizontally when dropping the popscreen
			KeyPopScroll = 0;
			KeyPopPos -= 10;
		}
		else
		{
			KeyPopPos = 0;
			PendingPop = popnum;
		}
	}